

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKeySequenceRevealerFilter.cpp
# Opt level: O0

bool __thiscall
QKeySequenceRevealerFilter::eventFilter
          (QKeySequenceRevealerFilter *this,QObject *object,QEvent *event)

{
  QWidget *pQVar1;
  bool bVar2;
  Type TVar3;
  QPoint *pQVar4;
  pair<QWidget_*,_QString> *ppVar5;
  pair<QWidget_*,_QString> *ppVar6;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  QHelpEvent *he_1;
  QHelpEvent *he;
  optional<std::pair<QWidget_*,_QString>_> widgetToolTip;
  int local_84;
  QRect local_78;
  QHelpEvent *local_68;
  QEvent **local_50;
  QEvent *local_20;
  QEvent *local_18 [2];
  byte local_1;
  
  local_20 = in_RDX;
  local_18[0] = in_RSI;
  TVar3 = QEvent::type(in_RDX);
  if (TVar3 == ToolTip || TVar3 == WhatsThis) {
    local_50 = local_18;
    eventFilter::anon_class_8_1_6424947d::operator()((anon_class_8_1_6424947d *)object);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::pair<QWidget_*,_QString>_> *)0x2360c9);
    if (bVar2) {
      TVar3 = QEvent::type(local_20);
      if (TVar3 == ToolTip) {
        local_68 = (QHelpEvent *)local_20;
        pQVar4 = QHelpEvent::globalPos((QHelpEvent *)local_20);
        ppVar5 = std::optional<std::pair<QWidget_*,_QString>_>::operator->
                           ((optional<std::pair<QWidget_*,_QString>_> *)0x236128);
        ppVar6 = std::optional<std::pair<QWidget_*,_QString>_>::operator->
                           ((optional<std::pair<QWidget_*,_QString>_> *)0x23613b);
        pQVar1 = ppVar6->first;
        QRect::QRect(&local_78);
        QToolTip::showText(pQVar4,&ppVar5->second,pQVar1,(QRect *)&local_78,-1);
      }
      else {
        TVar3 = QEvent::type(local_20);
        if (TVar3 == WhatsThis) {
          pQVar4 = QHelpEvent::globalPos((QHelpEvent *)local_20);
          ppVar5 = std::optional<std::pair<QWidget_*,_QString>_>::operator->
                             ((optional<std::pair<QWidget_*,_QString>_> *)0x2361ea);
          ppVar6 = std::optional<std::pair<QWidget_*,_QString>_>::operator->
                             ((optional<std::pair<QWidget_*,_QString>_> *)0x2361fd);
          QWhatsThis::showText(pQVar4,&ppVar5->second,ppVar6->first);
        }
      }
      local_1 = 1;
      local_84 = 1;
    }
    else {
      local_84 = 2;
    }
    std::optional<std::pair<QWidget_*,_QString>_>::~optional
              ((optional<std::pair<QWidget_*,_QString>_> *)0x23623c);
    if (local_84 == 1) goto LAB_0023626e;
  }
  local_1 = QObject::eventFilter(in_RDI,local_18[0]);
  local_1 = local_1 & 1;
LAB_0023626e:
  return (bool)(local_1 & 1);
}

Assistant:

bool QKeySequenceRevealerFilter::eventFilter(QObject *object, QEvent *event) {
    switch (event->type()) {
    case QEvent::ToolTip:
    case QEvent::WhatsThis: {
        const auto widgetToolTip = [&]() -> std::optional<WidgetToolTip> {
            std::optional<WidgetSequence> ws;

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QToolButton *>(object));
            }

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QPushButton *>(object));
            }

            if (!ws) {
                if (auto label = qobject_cast<QLabel *>(object); label && !label->text().isEmpty()) {
                    const auto sequence = QKeySequence::mnemonic(label->text());

                    if (!sequence.isEmpty()) {
                        ws = {label, sequence};
                    }
                }
            }

            return ws
                ? WidgetToolTip {ws->first, QSL("%1 (%2)").arg(ws->first->toolTip(), ws->second.toString()).trimmed()}
                : std::optional<WidgetToolTip> {};
        }();

        if (widgetToolTip) {
            if (event->type() == QEvent::ToolTip) {
                const auto he = static_cast<QHelpEvent *>(event);
                QToolTip::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            } else if (event->type() == QEvent::WhatsThis) {
                const auto he = static_cast<QHelpEvent *>(event);
                QWhatsThis::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            }

            return true;
        }

        break;
    }
    default:
        break;
    }

    return QObject::eventFilter(object, event);
}